

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  undefined4 in_ESI;
  nghttp2_stream *stream;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int32_t local_4;
  
  pnVar1 = nghttp2_session_get_stream
                     ((nghttp2_session *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                      (int32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (pnVar1 == (nghttp2_stream *)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = nghttp2_max_int32(0,pnVar1->remote_window_size);
  }
  return local_4;
}

Assistant:

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,
                                                      int32_t stream_id) {
  nghttp2_stream *stream;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }

  /* stream->remote_window_size can be negative when
     SETTINGS_INITIAL_WINDOW_SIZE is changed. */
  return nghttp2_max_int32(0, stream->remote_window_size);
}